

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O1

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *variance_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *smoothed_static_parameters)

{
  pointer pvVar1;
  pointer pvVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  allocator_type local_91;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_90;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_88;
  SymmetricMatrix local_70;
  
  if (this->is_valid_ == true) {
    pvVar1 = (variance_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (variance_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar1 != pvVar2) {
      uVar4 = (int)((long)pvVar2 - (long)pvVar1 >> 3) * -0x55555555;
      local_90 = smoothed_static_parameters;
      SymmetricMatrix::SymmetricMatrix
                (&local_70,
                 (int)((ulong)((long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3));
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (&local_88,(long)(int)uVar4,&local_70,&local_91);
      SymmetricMatrix::~SymmetricMatrix(&local_70);
      if (0 < (int)uVar4) {
        uVar5 = (ulong)(uVar4 & 0x7fffffff);
        lVar7 = 0;
        lVar6 = 0;
        do {
          bVar3 = SymmetricMatrix::SetDiagonal
                            ((SymmetricMatrix *)
                             ((long)&(local_88.
                                      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                     _vptr_SymmetricMatrix + lVar6),
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(((variance_vectors->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar7));
          if (!bVar3) {
            bVar3 = false;
            goto LAB_00107360;
          }
          lVar6 = lVar6 + 0x40;
          lVar7 = lVar7 + 0x18;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      bVar3 = Run(this,mean_vectors,&local_88,local_90);
LAB_00107360:
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&local_88)
      ;
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<std::vector<double> >& variance_vectors,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  if (!is_valid_ || variance_vectors.empty()) {
    return false;
  }

  const int sequence_length(static_cast<int>(variance_vectors.size()));
  std::vector<SymmetricMatrix> covariance_matrices(
      sequence_length,
      SymmetricMatrix(static_cast<int>(variance_vectors[0].size())));
  for (int t(0); t < sequence_length; ++t) {
    if (!covariance_matrices[t].SetDiagonal(variance_vectors[t])) {
      return false;
    }
  }
  return Run(mean_vectors, covariance_matrices, smoothed_static_parameters);
}